

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::InstanceBodySymbol::hasSameType(InstanceBodySymbol *this,InstanceBodySymbol *other)

{
  Symbol *pSVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference ppPVar5;
  long in_RSI;
  long in_RDI;
  Type *unaff_retaddr;
  Type *in_stack_00000008;
  Type *rt;
  Type *lt;
  ConstantValue *rv;
  ConstantValue *lv;
  Symbol *rp;
  Symbol *lp;
  iterator ri;
  iterator li;
  ParameterSymbol *in_stack_000000f8;
  undefined1 in_stack_00000100 [16];
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff48;
  ParameterSymbol *in_stack_ffffffffffffff50;
  ParameterSymbol *in_stack_ffffffffffffff58;
  DeclaredType *this_00;
  __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
  local_28;
  __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
  local_20 [3];
  bool local_1;
  
  if (in_RSI == in_RDI) {
    local_1 = true;
  }
  else if (*(long *)(in_RDI + 0x90) == *(long *)(in_RSI + 0x90)) {
    sVar3 = std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *
                       )0x3a4bf6);
    sVar4 = std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *
                       )0x3a4c0f);
    if (sVar3 == sVar4) {
      local_20[0]._M_current =
           (ParameterSymbolBase **)
           std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::begin
                     (in_stack_ffffffffffffff48);
      local_28._M_current =
           (ParameterSymbolBase **)
           std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::begin
                     (in_stack_ffffffffffffff48);
      while( true ) {
        std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *)
                   in_stack_ffffffffffffff58);
        bVar2 = __gnu_cxx::
                operator==<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffff48);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppPVar5 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                  ::operator*(local_20);
        pSVar1 = (*ppPVar5)->symbol;
        ppPVar5 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                  ::operator*(&local_28);
        this_00 = (DeclaredType *)(*ppPVar5)->symbol;
        if (pSVar1->kind != *(SymbolKind *)&this_00->parent) {
          return false;
        }
        if (pSVar1->kind == Parameter) {
          in_stack_ffffffffffffff50 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x3a4d08);
          SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff50);
          ParameterSymbol::getValue(in_stack_000000f8,(SourceRange)in_stack_00000100);
          in_stack_ffffffffffffff58 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x3a4d3a);
          SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff50);
          ParameterSymbol::getValue(in_stack_000000f8,(SourceRange)in_stack_00000100);
          bVar2 = slang::operator==((ConstantValue *)in_stack_ffffffffffffff50,
                                    (ConstantValue *)in_stack_ffffffffffffff48);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            return false;
          }
        }
        else {
          Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x3a4d95);
          DeclaredType::getType(this_00);
          Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x3a4db0);
          DeclaredType::getType(this_00);
          bVar2 = Type::isMatching(in_stack_00000008,unaff_retaddr);
          if (!bVar2) {
            return false;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                      *)in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        __gnu_cxx::
        __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                      *)in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InstanceBodySymbol::hasSameType(const InstanceBodySymbol& other) const {
    if (&other == this)
        return true;

    if (&definition != &other.definition)
        return false;

    if (parameters.size() != other.parameters.size())
        return false;

    for (auto li = parameters.begin(), ri = other.parameters.begin(); li != parameters.end();
         li++, ri++) {

        auto& lp = (*li)->symbol;
        auto& rp = (*ri)->symbol;
        if (lp.kind != rp.kind)
            return false;

        if (lp.kind == SymbolKind::Parameter) {
            auto& lv = lp.as<ParameterSymbol>().getValue();
            auto& rv = rp.as<ParameterSymbol>().getValue();
            if (lv != rv)
                return false;
        }
        else {
            auto& lt = lp.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    return true;
}